

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

RPCHelpMan * wallet::removeprunedfunds(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffffa48;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffa50;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffa58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  allocator<char> *in_stack_fffffffffffffa88;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffffa90;
  RPCArgOptions *in_stack_fffffffffffffa98;
  string *in_stack_fffffffffffffaa0;
  Fallback *in_stack_fffffffffffffaa8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffab0;
  string *in_stack_fffffffffffffab8;
  RPCArg *in_stack_fffffffffffffac0;
  RPCResult *result;
  RPCResults *this_00;
  RPCResult *this_01;
  allocator<char> local_48c;
  allocator<char> local_48b;
  allocator<char> local_48a;
  allocator<char> local_489;
  pointer local_488;
  _Alloc_hider _Stack_480;
  pointer local_478;
  undefined8 in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffbbc;
  allocator<char> local_422;
  allocator<char> local_421 [209];
  RPCMethodImpl *in_stack_fffffffffffffcb0;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  uVar3 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffffa58,(Optional *)in_stack_fffffffffffffa50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::__cxx11::string::string(in_stack_fffffffffffffa60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffa48);
  RPCArg::RPCArg(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                 (Type)((ulong)in_stack_fffffffffffffab0 >> 0x20),in_stack_fffffffffffffaa8,
                 in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffffaa8 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffffa48);
  __l._M_len = (size_type)in_stack_fffffffffffffa98;
  __l._M_array = in_stack_fffffffffffffa90;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffa88,__l,
             (allocator_type *)in_stack_fffffffffffffa80);
  this_01 = (RPCResult *)&stack0xfffffffffffffb97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  this_00 = (RPCResults *)&stack0xfffffffffffffb96;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  local_488 = (pointer)0x0;
  _Stack_480._M_p = (pointer)0x0;
  local_478 = (pointer)0x0;
  result = (RPCResult *)&local_488;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa48);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),(string *)result,in_stack_fffffffffffffab8,
             in_stack_fffffffffffffab0,(bool)skip_type_check);
  RPCResults::RPCResults(this_00,result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  HelpExampleCli(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::operator+(in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  HelpExampleRpc(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::operator+(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffffa48,(string *)0xc07f4e);
  this = (RPCArg *)&stack0xfffffffffffffb50;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::removeprunedfunds()::__0,void>
            (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)CONCAT44(in_stack_fffffffffffffbbc,uVar3),
             (string *)in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffba0,
             (RPCResults *)in_stack_fffffffffffffb98,(RPCExamples *)in_stack_fffffffffffffb90,
             in_stack_fffffffffffffcb0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_48c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_48b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_48a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_489);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb96);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb97);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffa58);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbb7);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbbf);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_422);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_421);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan removeprunedfunds()
{
    return RPCHelpMan{"removeprunedfunds",
                "\nDeletes the specified transaction from the wallet. Meant for use with pruned wallets and as a companion to importprunedfunds. This will affect wallet balances.\n",
                {
                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The hex-encoded id of the transaction you are deleting"},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
                    HelpExampleCli("removeprunedfunds", "\"a8d0c0184dde994a09ec054286f1ce581bebf46446a512166eae7628734ea0a5\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("removeprunedfunds", "\"a8d0c0184dde994a09ec054286f1ce581bebf46446a512166eae7628734ea0a5\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    uint256 hash(ParseHashV(request.params[0], "txid"));
    std::vector<uint256> vHash;
    vHash.push_back(hash);
    if (auto res = pwallet->RemoveTxs(vHash); !res) {
        throw JSONRPCError(RPC_WALLET_ERROR, util::ErrorString(res).original);
    }

    return UniValue::VNULL;
},
    };
}